

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::Result(XmlReporter *this,AssertionResult *assertionResult)

{
  XmlWriter *this_00;
  SourceLineInfo *pSVar1;
  IConfig *pIVar2;
  int iVar3;
  OfType OVar4;
  XmlWriter *pXVar5;
  string *this_01;
  allocator local_10b;
  allocator local_10a;
  allocator local_109;
  undefined1 local_108 [8];
  undefined1 local_100 [32];
  SourceLineInfo local_e0;
  SourceLineInfo local_b8;
  string local_90;
  string local_70;
  string local_50;
  
  pIVar2 = (this->m_config).m_fullConfig.m_p;
  local_e0.file._M_dataplus._M_p = (pointer)pIVar2;
  if (pIVar2 != (IConfig *)0x0) {
    (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(pIVar2);
  }
  iVar3 = (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[7])(pIVar2);
  if ((char)iVar3 == '\0') {
    OVar4 = (assertionResult->m_resultData).resultType;
    Ptr<Catch::IConfig>::~Ptr((Ptr<Catch::IConfig> *)(local_100 + 0x20));
    if (OVar4 == Ok) {
      return;
    }
  }
  else {
    Ptr<Catch::IConfig>::~Ptr((Ptr<Catch::IConfig> *)(local_100 + 0x20));
  }
  if ((assertionResult->m_info).capturedExpression._M_string_length == 0) {
    OVar4 = (assertionResult->m_resultData).resultType;
  }
  else {
    std::__cxx11::string::string((string *)local_100,"Expression",(allocator *)local_108);
    this_00 = &this->m_xml;
    pXVar5 = XmlWriter::startElement(this_00,(string *)local_100);
    std::__cxx11::string::string((string *)&local_90,"success",&local_109);
    pXVar5 = XmlWriter::writeAttribute
                       (pXVar5,&local_90,
                        ((assertionResult->m_resultData).resultType & FailureBit) == Ok);
    std::__cxx11::string::string((string *)&local_50,"filename",&local_10a);
    pSVar1 = &(assertionResult->m_info).lineInfo;
    SourceLineInfo::SourceLineInfo((SourceLineInfo *)(local_100 + 0x20),pSVar1);
    pXVar5 = XmlWriter::writeAttribute(pXVar5,&local_50,(string *)(local_100 + 0x20));
    std::__cxx11::string::string((string *)&local_70,"line",&local_10b);
    SourceLineInfo::SourceLineInfo(&local_b8,pSVar1);
    XmlWriter::writeAttribute<unsigned_long>(pXVar5,&local_70,&local_b8.line);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)(local_100 + 0x20));
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)local_100);
    std::__cxx11::string::string((string *)(local_100 + 0x20),"Original",(allocator *)&local_90);
    XmlWriter::scopedElement((XmlWriter *)local_100,(string *)this_00);
    AssertionResult::getExpression_abi_cxx11_(&local_b8.file,assertionResult);
    XmlWriter::writeText((XmlWriter *)local_100._0_8_,&local_b8.file,true);
    std::__cxx11::string::~string((string *)&local_b8);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_100);
    std::__cxx11::string::~string((string *)(local_100 + 0x20));
    std::__cxx11::string::string((string *)(local_100 + 0x20),"Expanded",(allocator *)&local_90);
    XmlWriter::scopedElement((XmlWriter *)local_100,(string *)this_00);
    std::__cxx11::string::string((string *)&local_b8,(string *)&assertionResult->m_resultData);
    XmlWriter::writeText((XmlWriter *)local_100._0_8_,&local_b8.file,true);
    std::__cxx11::string::~string((string *)&local_b8);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_100);
    std::__cxx11::string::~string((string *)(local_100 + 0x20));
    OVar4 = (assertionResult->m_resultData).resultType;
    this->m_currentTestSuccess = (bool)(this->m_currentTestSuccess & (OVar4 & FailureBit) == Ok);
  }
  if (OVar4 == Info) {
    std::__cxx11::string::string((string *)(local_100 + 0x20),"Info",(allocator *)&local_90);
    XmlWriter::scopedElement((XmlWriter *)local_100,(string *)&this->m_xml);
    std::__cxx11::string::string
              ((string *)&local_b8,(string *)&(assertionResult->m_resultData).message);
    XmlWriter::writeText((XmlWriter *)local_100._0_8_,&local_b8.file,true);
  }
  else {
    if (OVar4 != Warning) {
      if (OVar4 == ExplicitFailure) {
        std::__cxx11::string::string((string *)(local_100 + 0x20),"Failure",(allocator *)&local_90);
        XmlWriter::scopedElement((XmlWriter *)local_100,(string *)&this->m_xml);
        std::__cxx11::string::string
                  ((string *)&local_b8,(string *)&(assertionResult->m_resultData).message);
        XmlWriter::writeText((XmlWriter *)local_100._0_8_,&local_b8.file,true);
        std::__cxx11::string::~string((string *)&local_b8);
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_100);
        this_01 = (string *)(local_100 + 0x20);
      }
      else {
        if (OVar4 != ThrewException) goto LAB_00141e48;
        std::__cxx11::string::string((string *)local_100,"Exception",&local_109);
        XmlWriter::scopedElement((XmlWriter *)local_108,(string *)&this->m_xml);
        std::__cxx11::string::string((string *)&local_90,"filename",&local_10a);
        pSVar1 = &(assertionResult->m_info).lineInfo;
        SourceLineInfo::SourceLineInfo((SourceLineInfo *)(local_100 + 0x20),pSVar1);
        XmlWriter::writeAttribute((XmlWriter *)local_108,&local_90,(string *)(local_100 + 0x20));
        std::__cxx11::string::string((string *)&local_50,"line",&local_10b);
        SourceLineInfo::SourceLineInfo(&local_b8,pSVar1);
        XmlWriter::writeAttribute<unsigned_long>((XmlWriter *)local_108,&local_50,&local_b8.line);
        std::__cxx11::string::string
                  ((string *)&local_70,(string *)&(assertionResult->m_resultData).message);
        XmlWriter::writeText((XmlWriter *)local_108,&local_70,true);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)(local_100 + 0x20));
        std::__cxx11::string::~string((string *)&local_90);
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_108);
        this_01 = (string *)local_100;
      }
      std::__cxx11::string::~string(this_01);
      this->m_currentTestSuccess = false;
      goto LAB_00141e48;
    }
    std::__cxx11::string::string((string *)(local_100 + 0x20),"Warning",(allocator *)&local_90);
    XmlWriter::scopedElement((XmlWriter *)local_100,(string *)&this->m_xml);
    std::__cxx11::string::string
              ((string *)&local_b8,(string *)&(assertionResult->m_resultData).message);
    XmlWriter::writeText((XmlWriter *)local_100._0_8_,&local_b8.file,true);
  }
  std::__cxx11::string::~string((string *)&local_b8);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_100);
  std::__cxx11::string::~string((string *)(local_100 + 0x20));
LAB_00141e48:
  if ((assertionResult->m_info).capturedExpression._M_string_length != 0) {
    XmlWriter::endElement(&this->m_xml);
  }
  return;
}

Assistant:

virtual void Result( const Catch::AssertionResult& assertionResult ) {
            if( !m_config.fullConfig()->includeSuccessfulResults() && assertionResult.getResultType() == ResultWas::Ok )
                return;

            if( assertionResult.hasExpression() ) {
                m_xml.startElement( "Expression" )
                    .writeAttribute( "success", assertionResult.succeeded() )
                    .writeAttribute( "filename", assertionResult.getSourceInfo().file )
                    .writeAttribute( "line", assertionResult.getSourceInfo().line );

                m_xml.scopedElement( "Original" )
                    .writeText( assertionResult.getExpression() );
                m_xml.scopedElement( "Expanded" )
                    .writeText( assertionResult.getExpandedExpression() );
                m_currentTestSuccess &= assertionResult.succeeded();
            }

            switch( assertionResult.getResultType() ) {
                case ResultWas::ThrewException:
                    m_xml.scopedElement( "Exception" )
                        .writeAttribute( "filename", assertionResult.getSourceInfo().file )
                        .writeAttribute( "line", assertionResult.getSourceInfo().line )
                        .writeText( assertionResult.getMessage() );
                    m_currentTestSuccess = false;
                    break;
                case ResultWas::Info:
                    m_xml.scopedElement( "Info" )
                        .writeText( assertionResult.getMessage() );
                    break;
                case ResultWas::Warning:
                    m_xml.scopedElement( "Warning" )
                        .writeText( assertionResult.getMessage() );
                    break;
                case ResultWas::ExplicitFailure:
                    m_xml.scopedElement( "Failure" )
                        .writeText( assertionResult.getMessage() );
                    m_currentTestSuccess = false;
                    break;
                case ResultWas::Unknown:
                case ResultWas::Ok:
                case ResultWas::FailureBit:
                case ResultWas::ExpressionFailed:
                case ResultWas::Exception:
                case ResultWas::DidntThrowException:
                    break;
            }
            if( assertionResult.hasExpression() )
                m_xml.endElement();
        }